

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O2

double get_max_bitrate(AV1LevelSpec *level_spec,int tier,BITSTREAM_PROFILE profile)

{
  long lVar1;
  double dVar2;
  
  lVar1 = 0x30;
  if (tier != 0) {
    lVar1 = (ulong)(7 < level_spec->level) * 8 + 0x30;
  }
  if (profile == '\0') {
    dVar2 = 1.0;
  }
  else {
    dVar2 = *(double *)(&DAT_0043c0e0 + (ulong)(profile == '\x01') * 8);
  }
  return *(double *)(&level_spec->level + lVar1) * 1000000.0 * dVar2;
}

Assistant:

static double get_max_bitrate(const AV1LevelSpec *const level_spec, int tier,
                              BITSTREAM_PROFILE profile) {
  if (level_spec->level < SEQ_LEVEL_4_0) tier = 0;
  const double bitrate_basis =
      (tier ? level_spec->high_mbps : level_spec->main_mbps) * 1e6;
  const double bitrate_profile_factor =
      profile == PROFILE_0 ? 1.0 : (profile == PROFILE_1 ? 2.0 : 3.0);
  return bitrate_basis * bitrate_profile_factor;
}